

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::rc::TextureCubeArray::sample4
          (TextureCubeArray *this,Vec4 *output,Vec4 *packetTexcoords,float lodBias)

{
  undefined8 *puVar1;
  ulong uVar2;
  CubeFace CVar3;
  ulong uVar4;
  Vec3 *coords;
  long lVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  uint uVar10;
  uint uVar13;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  Vec2 faceCoords [4];
  Vec3 cubeCoords [4];
  undefined1 local_a8 [8];
  undefined1 local_a0 [8];
  undefined1 local_98 [8];
  undefined1 local_90 [8];
  Sampler *local_88;
  Vec4 *local_80;
  Vec3 local_78;
  undefined8 local_6c;
  float local_64;
  undefined8 local_60;
  float local_58;
  undefined8 local_54;
  float local_4c;
  TextureCubeArrayView local_40;
  
  if ((this->m_view).m_numLevels < 1) {
    fVar7 = 0.0;
  }
  else {
    fVar7 = (float)(((this->m_view).m_levels)->m_size).m_data[0];
  }
  local_88 = (Sampler *)&this->m_view;
  local_78.m_data[2] = packetTexcoords->m_data[2];
  local_78.m_data._0_8_ = *(undefined8 *)packetTexcoords->m_data;
  local_64 = packetTexcoords[1].m_data[2];
  local_6c = *(undefined8 *)packetTexcoords[1].m_data;
  local_60 = *(undefined8 *)packetTexcoords[2].m_data;
  local_58 = packetTexcoords[2].m_data[2];
  local_54 = *(undefined8 *)packetTexcoords[3].m_data;
  local_4c = packetTexcoords[3].m_data[2];
  coords = &local_78;
  lVar5 = 0;
  uVar4 = 0;
  local_80 = output;
  do {
    CVar3 = tcu::selectCubeFace(coords);
    tcu::projectToFace((CubeFace)local_a8,(Vec3 *)(ulong)CVar3);
    tcu::projectToFace((CubeFace)local_a0,(Vec3 *)(ulong)CVar3);
    tcu::projectToFace((CubeFace)local_98,(Vec3 *)(ulong)CVar3);
    tcu::projectToFace((CubeFace)local_90,(Vec3 *)(ulong)CVar3);
    uVar10 = (int)((uint)(uVar4 < 2) << 0x1f) >> 0x1f;
    uVar13 = (int)((uint)(uVar4 < 2) << 0x1f) >> 0x1f;
    uVar2 = CONCAT44(~uVar13 & (uint)(local_90._4_4_ - local_98._4_4_),
                     ~uVar10 & (uint)(local_90._0_4_ - local_98._0_4_)) |
            CONCAT44((uint)(local_a0._4_4_ - local_a8._4_4_) & uVar13,
                     (uint)(local_a0._0_4_ - local_a8._0_4_) & uVar10);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar2;
    auVar14._0_8_ = uVar2 ^ 0x8000000080000000;
    auVar14._8_4_ = 0x80000000;
    auVar14._12_4_ = 0x80000000;
    auVar11 = maxps(auVar14,auVar11);
    uVar10 = (uint)((uVar4 & 1) == 0);
    uVar13 = (int)(uVar10 << 0x1f) >> 0x1f;
    uVar10 = (int)(uVar10 << 0x1f) >> 0x1f;
    uVar2 = CONCAT44(~uVar10 & (uint)(local_90._4_4_ - local_a0._4_4_),
                     ~uVar13 & (uint)(local_90._0_4_ - local_a0._0_4_)) |
            CONCAT44((uint)(local_98._4_4_ - local_a8._4_4_) & uVar10,
                     (uint)(local_98._0_4_ - local_a8._0_4_) & uVar13);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar2;
    auVar6._0_8_ = uVar2 ^ 0x8000000080000000;
    auVar6._8_4_ = 0x80000000;
    auVar6._12_4_ = 0x80000000;
    auVar6 = maxps(auVar6,auVar12);
    uVar10 = -(uint)(auVar6._0_4_ <= auVar11._0_4_);
    uVar13 = -(uint)(auVar6._4_4_ <= auVar11._4_4_);
    fVar8 = (float)(~uVar10 & (uint)auVar6._0_4_ | (uint)auVar11._0_4_ & uVar10) * fVar7;
    fVar9 = (float)(~uVar13 & (uint)auVar6._4_4_ | (uint)auVar11._4_4_ & uVar13) * fVar7;
    uVar10 = -(uint)(fVar9 <= fVar8);
    fVar8 = logf((float)(~uVar10 & (uint)fVar9 | (uint)fVar8 & uVar10));
    tcu::TextureCubeArrayView::sample
              (&local_40,local_88,*(float *)((long)packetTexcoords->m_data + lVar5),
               *(float *)((long)packetTexcoords->m_data + lVar5 + 4),
               *(float *)((long)packetTexcoords->m_data + lVar5 + 8),
               *(float *)((long)packetTexcoords->m_data + lVar5 + 0xc),fVar8 * 1.442695 + lodBias);
    puVar1 = (undefined8 *)((long)local_80->m_data + lVar5);
    *puVar1 = local_40._0_8_;
    puVar1[1] = local_40.m_levels;
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x10;
    coords = coords + 1;
  } while (uVar4 != 4);
  return;
}

Assistant:

void TextureCubeArray::sample4 (tcu::Vec4 output[4], const tcu::Vec4 packetTexcoords[4], float lodBias) const
{
	const float		cubeSide		= (float)m_view.getSize();
	const tcu::Vec3	cubeCoords[4]	=
	{
		packetTexcoords[0].toWidth<3>(),
		packetTexcoords[1].toWidth<3>(),
		packetTexcoords[2].toWidth<3>(),
		packetTexcoords[3].toWidth<3>()
	};

	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::CubeFace face			= tcu::selectCubeFace(cubeCoords[fragNdx]);
		const tcu::Vec2		faceCoords[4]	=
		{
			tcu::projectToFace(face, cubeCoords[0]),
			tcu::projectToFace(face, cubeCoords[1]),
			tcu::projectToFace(face, cubeCoords[2]),
			tcu::projectToFace(face, cubeCoords[3]),
		};

		const tcu::Vec2 dFdx0 = faceCoords[1] - faceCoords[0];
		const tcu::Vec2 dFdx1 = faceCoords[3] - faceCoords[2];
		const tcu::Vec2 dFdy0 = faceCoords[2] - faceCoords[0];
		const tcu::Vec2 dFdy1 = faceCoords[3] - faceCoords[1];

		const tcu::Vec2& dFdx = (fragNdx & 2) ? dFdx1 : dFdx0;
		const tcu::Vec2& dFdy = (fragNdx & 1) ? dFdy1 : dFdy0;

		const float mu = de::max(de::abs(dFdx.x()), de::abs(dFdy.x()));
		const float mv = de::max(de::abs(dFdx.y()), de::abs(dFdy.y()));
		const float p = de::max(mu * cubeSide, mv * cubeSide);

		const float	lod = deFloatLog2(p) + lodBias;

		output[fragNdx] = sample(packetTexcoords[fragNdx].x(), packetTexcoords[fragNdx].y(), packetTexcoords[fragNdx].z(), packetTexcoords[fragNdx].w(), lod);
	}
}